

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_ptr_from_python.hpp
# Opt level: O1

void boost::python::converter::shared_ptr_from_python<timestamp_t,_boost::shared_ptr>::construct
               (PyObject *source,rvalue_from_python_stage1_data *data)

{
  shared_ptr<void> hold_convertible_ref_count;
  shared_ptr_deleter sStack_38;
  PyObject *local_30;
  shared_ptr<void> local_28;
  
  if ((PyObject *)data->convertible == source) {
    data[1].convertible = (void *)0x0;
    data[1].construct = (constructor_function)0x0;
  }
  else {
    if (source == (PyObject *)0x0) {
      throw_error_already_set();
    }
    source->ob_refcnt = source->ob_refcnt + 1;
    local_30 = source;
    shared_ptr_deleter::shared_ptr_deleter(&sStack_38);
    shared_ptr<void>::shared_ptr<void,boost::python::converter::shared_ptr_deleter>
              (&local_28,(void *)0x0,&sStack_38);
    shared_ptr_deleter::~shared_ptr_deleter(&sStack_38);
    if ((local_30 != (PyObject *)0x0) &&
       (local_30->ob_refcnt = local_30->ob_refcnt + -1, local_30->ob_refcnt == 0)) {
      _Py_Dealloc();
    }
    data[1].convertible = data->convertible;
    data[1].construct = (constructor_function)local_28.pn.pi_;
    if (local_28.pn.pi_ != (sp_counted_base *)0x0) {
      LOCK();
      (local_28.pn.pi_)->use_count_ = (local_28.pn.pi_)->use_count_ + 1;
      UNLOCK();
    }
    boost::detail::shared_count::~shared_count(&local_28.pn);
  }
  data->convertible = data + 1;
  return;
}

Assistant:

static void construct(PyObject* source, rvalue_from_python_stage1_data* data)
  {
    void* const storage = ((converter::rvalue_from_python_storage<SP<T> >*)data)->storage.bytes;
    // Deal with the "None" case.
    if (data->convertible == source)
      new (storage) SP<T>();
    else
    {
      SP<void> hold_convertible_ref_count(
	 (void*)0, shared_ptr_deleter(handle<>(borrowed(source))) );
      // use aliasing constructor
      new (storage) SP<T>(hold_convertible_ref_count,
			  static_cast<T*>(data->convertible));
    }

    data->convertible = storage;
  }